

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_linear_resampler_get_required_input_frame_count
                    (ma_linear_resampler *pResampler,ma_uint64 outputFrameCount,
                    ma_uint64 *pInputFrameCount)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pInputFrameCount != (ma_uint64 *)0x0) &&
     (*pInputFrameCount = 0, pResampler != (ma_linear_resampler *)0x0)) {
    if (outputFrameCount == 0) {
      mVar1 = MA_SUCCESS;
    }
    else {
      mVar1 = MA_SUCCESS;
      *pInputFrameCount =
           ((ulong)pResampler->inAdvanceFrac * (outputFrameCount - 1) +
           (ulong)pResampler->inTimeFrac) / (ulong)(pResampler->config).sampleRateOut +
           (ulong)pResampler->inAdvanceInt * (outputFrameCount - 1) + (ulong)pResampler->inTimeInt;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_linear_resampler_get_required_input_frame_count(const ma_linear_resampler* pResampler, ma_uint64 outputFrameCount, ma_uint64* pInputFrameCount)
{
    ma_uint64 inputFrameCount;

    if (pInputFrameCount == NULL) {
        return MA_INVALID_ARGS;
    }

    *pInputFrameCount = 0;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (outputFrameCount == 0) {
        return MA_SUCCESS;
    }

    /* Any whole input frames are consumed before the first output frame is generated. */
    inputFrameCount = pResampler->inTimeInt;
    outputFrameCount -= 1;

    /* The rest of the output frames can be calculated in constant time. */
    inputFrameCount += outputFrameCount * pResampler->inAdvanceInt;
    inputFrameCount += (pResampler->inTimeFrac + (outputFrameCount * pResampler->inAdvanceFrac)) / pResampler->config.sampleRateOut;

    *pInputFrameCount = inputFrameCount;

    return MA_SUCCESS;
}